

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O2

ON_Xform * __thiscall ON_Xform::operator=(ON_Xform *this,ON_Matrix *src)

{
  double **ppdVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  double (*padVar6) [4];
  ON_Xform *pOVar7;
  ulong uVar8;
  ON_Xform *pOVar9;
  uint uVar10;
  byte bVar11;
  
  bVar11 = 0;
  uVar2 = ON_Matrix::RowCount(src);
  if (3 < (int)uVar2) {
    uVar2 = 4;
  }
  uVar3 = ON_Matrix::ColCount(src);
  uVar10 = 4;
  if ((int)uVar3 < 4) {
    uVar10 = uVar3;
  }
  pOVar7 = &IdentityTransformation;
  pOVar9 = this;
  for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
    pOVar9->m_xform[0][0] = pOVar7->m_xform[0][0];
    pOVar7 = (ON_Xform *)((long)pOVar7 + ((ulong)bVar11 * -2 + 1) * 8);
    pOVar9 = (ON_Xform *)((long)pOVar9 + ((ulong)bVar11 * -2 + 1) * 8);
  }
  uVar4 = 0;
  if ((int)uVar10 < 1) {
    uVar10 = 0;
  }
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  padVar6 = (double (*) [4])this;
  for (; uVar4 != uVar2; uVar4 = uVar4 + 1) {
    ppdVar1 = src->m;
    for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
      (*(double (*) [4])*padVar6)[uVar8] = ppdVar1[uVar4][uVar8];
    }
    padVar6 = padVar6 + 1;
  }
  return this;
}

Assistant:

ON_Xform& ON_Xform::operator=(const ON_Matrix& src)
{
  int i,j;
  i = src.RowCount();
  const int maxi = (i>4)?4:i;
  j = src.ColCount();
  const int maxj = (j>4)?4:j;
  *this = ON_Xform::IdentityTransformation;
  for ( i = 0; i < maxi; i++ ) for ( j = 0; j < maxj; j++ ) {
    m_xform[i][j] = src.m[i][j];
  }
  return *this;
}